

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharactersUTF8(ImGuiIO *this,char *utf8_chars)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  uint *unaff_retaddr;
  uint c;
  
  for (; *in_RSI != '\0'; in_RSI = in_RSI + iVar1) {
    iVar1 = ImTextCharFromUtf8(unaff_retaddr,in_RDI,in_RSI);
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharactersUTF8(const char* utf8_chars)
{
    while (*utf8_chars != 0)
    {
        unsigned int c = 0;
        utf8_chars += ImTextCharFromUtf8(&c, utf8_chars, NULL);
        if (c != 0)
            InputQueueCharacters.push_back((ImWchar)c);
    }
}